

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::FlipBoard(BoardView *this,int mode)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiIO *pIVar5;
  uint uVar6;
  float local_3938;
  float fStack_3934;
  ImGuiIO io;
  
  IVar3 = ImGui::GetMousePos();
  fVar1 = (this->m_board_surface).x;
  fVar2 = (this->m_board_surface).y;
  IVar4 = ScreenToCoord(this,IVar3.x,IVar3.y,1.0);
  pIVar5 = ImGui::GetIO();
  ImGuiIO::ImGuiIO(&io,pIVar5);
  uVar6 = (this->config).flipMode;
  *(byte *)&this->m_current_side = (byte)this->m_current_side ^ 1;
  this->m_dx = -this->m_dx;
  if (this->m_flipVertically == true) {
    if (mode == 1) {
      uVar6 = 0;
    }
    Rotate(this,2);
    if (uVar6 != io.KeyShift) {
      local_3938 = IVar4.x;
      fStack_3934 = IVar4.y;
      SetTarget(this,local_3938,fStack_3934);
      Pan(this,4,(int)(fVar1 * 0.5 - IVar3.x));
      Pan(this,2,(int)(fVar2 * 0.5 - IVar3.y));
    }
  }
  this->m_needsRedraw = true;
  ImVector<unsigned_short>::~ImVector(&io.InputQueueCharacters);
  return;
}

Assistant:

void BoardView::FlipBoard(int mode) {
	ImVec2 mpos = ImGui::GetMousePos();
	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;
	ImVec2 bpos = ScreenToCoord(mpos.x, mpos.y);
	auto io     = ImGui::GetIO();

	if (mode == 1)
		mode = 0;
	else
		mode = config.flipMode;

	m_current_side ^= 1;
	m_dx = -m_dx;
	if (m_flipVertically) {
		Rotate(2);
		if (io.KeyShift ^ mode) {
			SetTarget(bpos.x, bpos.y);
			Pan(DIR_RIGHT, view.x / 2 - mpos.x);
			Pan(DIR_DOWN, view.y / 2 - mpos.y);
		}
	}
	m_needsRedraw = true;
}